

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
libcellml::Parser::ParserImpl::loadReset
          (ParserImpl *this,ResetPtr *reset,ComponentPtr *component,XmlNodePtr *node)

{
  IssueImpl *pIVar1;
  size_t sVar2;
  bool bVar3;
  element_type *peVar4;
  element_type *peVar5;
  Entity *this_00;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  element_type *peVar9;
  element_type *peVar10;
  allocator<char> local_8a9;
  string local_8a8;
  allocator<char> local_881;
  string local_880;
  shared_ptr<libcellml::XmlNode> local_860;
  string local_850;
  string local_830;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_810;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b0;
  undefined1 local_790 [8];
  IssuePtr issue_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  undefined1 local_740 [8];
  IssuePtr issue_6;
  string textNode;
  string local_708;
  allocator<char> local_6e1;
  string local_6e0;
  size_t local_6c0;
  size_t resetValueCount;
  size_t testValueCount;
  XmlNodePtr childNode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  undefined1 local_640 [8];
  IssuePtr issue_5;
  string local_620;
  string local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  undefined1 local_560 [8];
  IssuePtr issue_4;
  string local_530;
  string local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  undefined1 local_430 [8];
  IssuePtr issue_3;
  string local_410;
  Reset local_3f0;
  undefined1 local_3e0 [8];
  string variableName_1;
  string local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  undefined1 local_2c0 [8];
  IssuePtr issue_2;
  string local_2a0;
  Reset local_280;
  undefined1 local_270 [8];
  string variableName;
  string local_230;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  undefined1 local_170 [8];
  IssuePtr issue_1;
  VariablePtr testVariable;
  string testVariableReference;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  IssuePtr issue;
  VariablePtr referencedVariable;
  string variableReference;
  undefined1 local_40 [8];
  XmlAttributePtr attribute;
  bool orderDefined;
  bool orderValid;
  int order;
  XmlNodePtr *node_local;
  ComponentPtr *component_local;
  ResetPtr *reset_local;
  ParserImpl *this_local;
  
  attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_4_ = 0;
  attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._3_1_ = 0;
  attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._2_1_ = 0;
  std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             node);
  XmlNode::firstAttribute((XmlNode *)local_40);
  while (bVar3 = std::operator!=((shared_ptr<libcellml::XmlAttribute> *)local_40,(nullptr_t)0x0),
        bVar3) {
    peVar4 = std::
             __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_40);
    bVar3 = XmlAttribute::isType(peVar4,"variable","");
    if (bVar3) {
      peVar4 = std::
               __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_40);
      XmlAttribute::value_abi_cxx11_
                ((string *)
                 &referencedVariable.
                  super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 peVar4);
      peVar9 = std::
               __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)component);
      Component::variable((Component *)
                          &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount,(string *)peVar9);
      bVar3 = std::operator==((shared_ptr<libcellml::Variable> *)
                              &issue.
                               super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount,(nullptr_t)0x0);
      if (bVar3) {
        Issue::IssueImpl::create();
        peVar8 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_90);
        pIVar1 = peVar8->mPimpl;
        std::operator+(&local_110,"Reset referencing variable \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &referencedVariable.
                        super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
        std::operator+(&local_f0,&local_110,
                       "\' is not a valid reference for a variable in component \'");
        peVar9 = std::
                 __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)component);
        NamedEntity::name_abi_cxx11_
                  ((string *)((long)&testVariableReference.field_2 + 8),(NamedEntity *)peVar9);
        std::operator+(&local_d0,&local_f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&testVariableReference.field_2 + 8));
        std::operator+(&local_b0,&local_d0,"\'.");
        Issue::IssueImpl::setDescription(pIVar1,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)(testVariableReference.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_110);
        peVar8 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_90);
        peVar10 = std::
                  __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&peVar8->mPimpl->mItem);
        AnyCellmlElement::AnyCellmlElementImpl::setReset(peVar10->mPimpl,reset,RESET);
        peVar8 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_90);
        Issue::IssueImpl::setReferenceRule(peVar8->mPimpl,RESET_VARIABLE_REFERENCE);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_90);
        std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_90);
      }
      else {
        peVar6 = std::
                 __shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)reset);
        Reset::setVariable(peVar6,(VariablePtr *)
                                  &issue.
                                   super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
      }
      std::shared_ptr<libcellml::Variable>::~shared_ptr
                ((shared_ptr<libcellml::Variable> *)
                 &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      std::__cxx11::string::~string
                ((string *)
                 &referencedVariable.
                  super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    else {
      peVar4 = std::
               __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_40);
      bVar3 = XmlAttribute::isType(peVar4,"test_variable","");
      if (bVar3) {
        peVar4 = std::
                 __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_40);
        XmlAttribute::value_abi_cxx11_
                  ((string *)
                   &testVariable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,peVar4);
        peVar9 = std::
                 __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)component);
        Component::variable((Component *)
                            &issue_1.
                             super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount,(string *)peVar9);
        bVar3 = std::operator==((shared_ptr<libcellml::Variable> *)
                                &issue_1.
                                 super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount,(nullptr_t)0x0);
        if (bVar3) {
          Issue::IssueImpl::create();
          peVar8 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_170);
          pIVar1 = peVar8->mPimpl;
          std::operator+(&local_1f0,"Reset referencing test_variable \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &testVariable.
                          super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
          std::operator+(&local_1d0,&local_1f0,
                         "\' is not a valid reference for a variable in component \'");
          peVar9 = std::
                   __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)component);
          NamedEntity::name_abi_cxx11_(&local_210,(NamedEntity *)peVar9);
          std::operator+(&local_1b0,&local_1d0,&local_210);
          std::operator+(&local_190,&local_1b0,"\'.");
          Issue::IssueImpl::setDescription(pIVar1,&local_190);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::__cxx11::string::~string((string *)&local_210);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::string::~string((string *)&local_1f0);
          peVar8 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_170);
          peVar10 = std::
                    __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&peVar8->mPimpl->mItem);
          AnyCellmlElement::AnyCellmlElementImpl::setReset(peVar10->mPimpl,reset,RESET);
          peVar8 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_170);
          Issue::IssueImpl::setReferenceRule(peVar8->mPimpl,RESET_TEST_VARIABLE_REFERENCE);
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_170);
          std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_170);
        }
        else {
          peVar6 = std::
                   __shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)reset);
          Reset::setTestVariable
                    (peVar6,(VariablePtr *)
                            &issue_1.
                             super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
        }
        std::shared_ptr<libcellml::Variable>::~shared_ptr
                  ((shared_ptr<libcellml::Variable> *)
                   &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__cxx11::string::~string
                  ((string *)
                   &testVariable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      }
      else {
        peVar4 = std::
                 __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_40);
        bVar3 = XmlAttribute::isType(peVar4,"order","");
        if (bVar3) {
          attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._2_1_ = 1;
          peVar4 = std::
                   __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_40);
          XmlAttribute::value_abi_cxx11_(&local_230,peVar4);
          attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._3_1_ = isCellMLInteger(&local_230);
          std::__cxx11::string::~string((string *)&local_230);
          if ((attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._3_1_ & 1) == 0) {
            std::__cxx11::string::string((string *)local_3e0);
            std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)reset);
            Reset::variable(&local_3f0);
            bVar3 = std::operator!=((shared_ptr<libcellml::Variable> *)&local_3f0,(nullptr_t)0x0);
            std::shared_ptr<libcellml::Variable>::~shared_ptr
                      ((shared_ptr<libcellml::Variable> *)&local_3f0);
            if (bVar3) {
              std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)reset);
              Reset::variable((Reset *)&issue_3.
                                        super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
              peVar5 = std::
                       __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&issue_3.
                                        super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
              NamedEntity::name_abi_cxx11_(&local_410,&peVar5->super_NamedEntity);
              std::__cxx11::string::operator=((string *)local_3e0,(string *)&local_410);
              std::__cxx11::string::~string((string *)&local_410);
              std::shared_ptr<libcellml::Variable>::~shared_ptr
                        ((shared_ptr<libcellml::Variable> *)
                         &issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
            Issue::IssueImpl::create();
            peVar8 = std::
                     __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_430);
            pIVar1 = peVar8->mPimpl;
            peVar9 = std::
                     __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)component);
            NamedEntity::name_abi_cxx11_(&local_510,(NamedEntity *)peVar9);
            std::operator+(&local_4f0,"Reset in component \'",&local_510);
            std::operator+(&local_4d0,&local_4f0,"\' referencing variable \'");
            std::operator+(&local_4b0,&local_4d0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_3e0);
            std::operator+(&local_490,&local_4b0,"\' has a non-integer order value \'");
            peVar4 = std::
                     __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_40);
            XmlAttribute::value_abi_cxx11_(&local_530,peVar4);
            std::operator+(&local_470,&local_490,&local_530);
            std::operator+(&local_450,&local_470,"\'.");
            Issue::IssueImpl::setDescription(pIVar1,&local_450);
            std::__cxx11::string::~string((string *)&local_450);
            std::__cxx11::string::~string((string *)&local_470);
            std::__cxx11::string::~string((string *)&local_530);
            std::__cxx11::string::~string((string *)&local_490);
            std::__cxx11::string::~string((string *)&local_4b0);
            std::__cxx11::string::~string((string *)&local_4d0);
            std::__cxx11::string::~string((string *)&local_4f0);
            std::__cxx11::string::~string((string *)&local_510);
            peVar8 = std::
                     __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_430);
            peVar10 = std::
                      __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&peVar8->mPimpl->mItem);
            AnyCellmlElement::AnyCellmlElementImpl::setReset(peVar10->mPimpl,reset,RESET);
            peVar8 = std::
                     __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_430);
            Issue::IssueImpl::setReferenceRule(peVar8->mPimpl,RESET_ORDER_VALUE);
            Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_430);
            std::shared_ptr<libcellml::Issue>::~shared_ptr
                      ((shared_ptr<libcellml::Issue> *)local_430);
            std::__cxx11::string::~string((string *)local_3e0);
          }
          else {
            peVar4 = std::
                     __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_40);
            XmlAttribute::value_abi_cxx11_((string *)((long)&variableName.field_2 + 8),peVar4);
            attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._3_1_ =
                 convertToInt((string *)((long)&variableName.field_2 + 8),
                              (int *)((long)&attribute.
                                             super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi + 4));
            std::__cxx11::string::~string((string *)(variableName.field_2._M_local_buf + 8));
            if ((attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._3_1_ & 1) == 0) {
              std::__cxx11::string::string((string *)local_270);
              std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)reset);
              Reset::variable(&local_280);
              bVar3 = std::operator!=((shared_ptr<libcellml::Variable> *)&local_280,(nullptr_t)0x0);
              std::shared_ptr<libcellml::Variable>::~shared_ptr
                        ((shared_ptr<libcellml::Variable> *)&local_280);
              if (bVar3) {
                std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)reset);
                Reset::variable((Reset *)&issue_2.
                                          super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount);
                peVar5 = std::
                         __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)&issue_2.
                                          super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount);
                NamedEntity::name_abi_cxx11_(&local_2a0,&peVar5->super_NamedEntity);
                std::__cxx11::string::operator=((string *)local_270,(string *)&local_2a0);
                std::__cxx11::string::~string((string *)&local_2a0);
                std::shared_ptr<libcellml::Variable>::~shared_ptr
                          ((shared_ptr<libcellml::Variable> *)
                           &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
              }
              Issue::IssueImpl::create();
              peVar8 = std::
                       __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_2c0);
              pIVar1 = peVar8->mPimpl;
              peVar9 = std::
                       __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)component);
              NamedEntity::name_abi_cxx11_(&local_3a0,(NamedEntity *)peVar9);
              std::operator+(&local_380,"Reset in component \'",&local_3a0);
              std::operator+(&local_360,&local_380,"\' referencing variable \'");
              std::operator+(&local_340,&local_360,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_270);
              std::operator+(&local_320,&local_340,"\' has an out of range integer order value \'");
              peVar4 = std::
                       __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_40);
              XmlAttribute::value_abi_cxx11_((string *)((long)&variableName_1.field_2 + 8),peVar4);
              std::operator+(&local_300,&local_320,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&variableName_1.field_2 + 8));
              std::operator+(&local_2e0,&local_300,"\'.");
              Issue::IssueImpl::setDescription(pIVar1,&local_2e0);
              std::__cxx11::string::~string((string *)&local_2e0);
              std::__cxx11::string::~string((string *)&local_300);
              std::__cxx11::string::~string((string *)(variableName_1.field_2._M_local_buf + 8));
              std::__cxx11::string::~string((string *)&local_320);
              std::__cxx11::string::~string((string *)&local_340);
              std::__cxx11::string::~string((string *)&local_360);
              std::__cxx11::string::~string((string *)&local_380);
              std::__cxx11::string::~string((string *)&local_3a0);
              peVar8 = std::
                       __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_2c0);
              peVar10 = std::
                        __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)&peVar8->mPimpl->mItem);
              AnyCellmlElement::AnyCellmlElementImpl::setReset(peVar10->mPimpl,reset,RESET);
              peVar8 = std::
                       __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_2c0);
              Issue::IssueImpl::setReferenceRule(peVar8->mPimpl,RESET_ORDER_VALUE);
              Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_2c0);
              std::shared_ptr<libcellml::Issue>::~shared_ptr
                        ((shared_ptr<libcellml::Issue> *)local_2c0);
              std::__cxx11::string::~string((string *)local_270);
            }
          }
        }
        else {
          peVar4 = std::
                   __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_40);
          bVar3 = XmlAttribute::isType(peVar4,"id","");
          if (bVar3) {
            this_00 = (Entity *)
                      std::
                      __shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)reset);
            peVar4 = std::
                     __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_40);
            XmlAttribute::value_abi_cxx11_
                      ((string *)
                       &issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,peVar4);
            Entity::setId(this_00,(string *)
                                  &issue_4.
                                   super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
            std::__cxx11::string::~string
                      ((string *)
                       &issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          else {
            Issue::IssueImpl::create();
            peVar8 = std::
                     __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_560);
            pIVar1 = peVar8->mPimpl;
            peVar9 = std::
                     __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)component);
            NamedEntity::name_abi_cxx11_(&local_600,(NamedEntity *)peVar9);
            std::operator+(&local_5e0,"Reset in component \'",&local_600);
            std::operator+(&local_5c0,&local_5e0,"\' has an invalid attribute \'");
            peVar4 = std::
                     __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_40);
            XmlAttribute::name_abi_cxx11_(&local_620,peVar4);
            std::operator+(&local_5a0,&local_5c0,&local_620);
            std::operator+(&local_580,&local_5a0,"\'.");
            Issue::IssueImpl::setDescription(pIVar1,&local_580);
            std::__cxx11::string::~string((string *)&local_580);
            std::__cxx11::string::~string((string *)&local_5a0);
            std::__cxx11::string::~string((string *)&local_620);
            std::__cxx11::string::~string((string *)&local_5c0);
            std::__cxx11::string::~string((string *)&local_5e0);
            std::__cxx11::string::~string((string *)&local_600);
            peVar8 = std::
                     __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_560);
            peVar10 = std::
                      __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&peVar8->mPimpl->mItem);
            AnyCellmlElement::AnyCellmlElementImpl::setReset(peVar10->mPimpl,reset,RESET);
            peVar8 = std::
                     __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_560);
            Issue::IssueImpl::setReferenceRule(peVar8->mPimpl,RESET_ATTRIBUTE_REQUIRED);
            Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_560);
            std::shared_ptr<libcellml::Issue>::~shared_ptr
                      ((shared_ptr<libcellml::Issue> *)local_560);
          }
        }
      }
    }
    std::__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_40);
    XmlAttribute::next((XmlAttribute *)
                       &issue_5.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    std::shared_ptr<libcellml::XmlAttribute>::operator=
              ((shared_ptr<libcellml::XmlAttribute> *)local_40,
               (shared_ptr<libcellml::XmlAttribute> *)
               &issue_5.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::shared_ptr<libcellml::XmlAttribute>::~shared_ptr
              ((shared_ptr<libcellml::XmlAttribute> *)
               &issue_5.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
  }
  if ((attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount
       ._M_pi._3_1_ & 1) == 0) {
    if ((attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._2_1_ & 1) == 0) {
      Issue::IssueImpl::create();
      peVar8 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_640);
      pIVar1 = peVar8->mPimpl;
      peVar9 = std::
               __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)component);
      NamedEntity::name_abi_cxx11_
                ((string *)
                 &childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(NamedEntity *)peVar9);
      std::operator+(&local_680,"Reset in component \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
      std::operator+(&local_660,&local_680,"\' does not have its order set.");
      Issue::IssueImpl::setDescription(pIVar1,&local_660);
      std::__cxx11::string::~string((string *)&local_660);
      std::__cxx11::string::~string((string *)&local_680);
      std::__cxx11::string::~string
                ((string *)
                 &childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      peVar8 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_640);
      peVar10 = std::
                __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&peVar8->mPimpl->mItem);
      AnyCellmlElement::AnyCellmlElementImpl::setReset(peVar10->mPimpl,reset,RESET);
      peVar8 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_640);
      Issue::IssueImpl::setReferenceRule(peVar8->mPimpl,RESET_ORDER_VALUE);
      Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_640);
      std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_640);
    }
  }
  else {
    peVar6 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)reset);
    Reset::setOrder(peVar6,attribute.
                           super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi._4_4_);
  }
  std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             node);
  XmlNode::firstChild((XmlNode *)&testValueCount);
  resetValueCount = 0;
  local_6c0 = 0;
  while (bVar3 = std::operator!=((shared_ptr<libcellml::XmlNode> *)&testValueCount,(nullptr_t)0x0),
        sVar2 = resetValueCount, bVar3) {
    peVar7 = std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&testValueCount);
    bVar3 = XmlNode::isCellml20Element(peVar7,"test_value");
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6e0,"test_value",&local_6e1);
      loadResetChild(this,&local_6e0,reset,component,(XmlNodePtr *)&testValueCount);
      std::__cxx11::string::~string((string *)&local_6e0);
      std::allocator<char>::~allocator(&local_6e1);
      resetValueCount = resetValueCount + 1;
    }
    else {
      peVar7 = std::
               __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&testValueCount);
      bVar3 = XmlNode::isCellml20Element(peVar7,"reset_value");
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_708,"reset_value",
                   (allocator<char> *)(textNode.field_2._M_local_buf + 0xf));
        loadResetChild(this,&local_708,reset,component,(XmlNodePtr *)&testValueCount);
        std::__cxx11::string::~string((string *)&local_708);
        std::allocator<char>::~allocator((allocator<char> *)(textNode.field_2._M_local_buf + 0xf));
        local_6c0 = local_6c0 + 1;
      }
      else {
        peVar7 = std::
                 __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&testValueCount);
        bVar3 = XmlNode::isText(peVar7);
        if (bVar3) {
          peVar7 = std::
                   __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&testValueCount);
          XmlNode::convertToString_abi_cxx11_
                    ((string *)
                     &issue_6.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,peVar7);
          bVar3 = hasNonWhitespaceCharacters
                            ((string *)
                             &issue_6.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
          if (bVar3) {
            Issue::IssueImpl::create();
            peVar8 = std::
                     __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_740);
            pIVar1 = peVar8->mPimpl;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &issue_7.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,"Reset has an invalid non-whitespace child text element \'"
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &issue_6.
                             super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
            std::operator+(&local_760,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &issue_7.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,
                           "\'. Either a test_value block or a reset_value block is expected.");
            Issue::IssueImpl::setDescription(pIVar1,&local_760);
            std::__cxx11::string::~string((string *)&local_760);
            std::__cxx11::string::~string
                      ((string *)
                       &issue_7.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            peVar8 = std::
                     __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_740);
            peVar10 = std::
                      __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&peVar8->mPimpl->mItem);
            AnyCellmlElement::AnyCellmlElementImpl::setReset(peVar10->mPimpl,reset,RESET);
            peVar8 = std::
                     __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_740);
            Issue::IssueImpl::setReferenceRule(peVar8->mPimpl,XML_UNEXPECTED_CHARACTER);
            Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_740);
            std::shared_ptr<libcellml::Issue>::~shared_ptr
                      ((shared_ptr<libcellml::Issue> *)local_740);
          }
          std::__cxx11::string::~string
                    ((string *)
                     &issue_6.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        else {
          peVar7 = std::
                   __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&testValueCount);
          bVar3 = XmlNode::isComment(peVar7);
          if (!bVar3) {
            Issue::IssueImpl::create();
            peVar8 = std::
                     __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_790);
            pIVar1 = peVar8->mPimpl;
            peVar9 = std::
                     __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)component);
            NamedEntity::name_abi_cxx11_(&local_830,(NamedEntity *)peVar9);
            std::operator+(&local_810,"Reset in component \'",&local_830);
            std::operator+(&local_7f0,&local_810,"\' has an invalid child \'");
            peVar7 = std::
                     __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&testValueCount);
            XmlNode::name_abi_cxx11_(&local_850,peVar7);
            std::operator+(&local_7d0,&local_7f0,&local_850);
            std::operator+(&local_7b0,&local_7d0,"\'.");
            Issue::IssueImpl::setDescription(pIVar1,&local_7b0);
            std::__cxx11::string::~string((string *)&local_7b0);
            std::__cxx11::string::~string((string *)&local_7d0);
            std::__cxx11::string::~string((string *)&local_850);
            std::__cxx11::string::~string((string *)&local_7f0);
            std::__cxx11::string::~string((string *)&local_810);
            std::__cxx11::string::~string((string *)&local_830);
            peVar8 = std::
                     __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_790);
            peVar10 = std::
                      __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&peVar8->mPimpl->mItem);
            AnyCellmlElement::AnyCellmlElementImpl::setReset(peVar10->mPimpl,reset,RESET);
            peVar8 = std::
                     __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_790);
            Issue::IssueImpl::setReferenceRule(peVar8->mPimpl,XML_UNEXPECTED_ELEMENT);
            Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_790);
            std::shared_ptr<libcellml::Issue>::~shared_ptr
                      ((shared_ptr<libcellml::Issue> *)local_790);
          }
        }
      }
    }
    std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &testValueCount);
    XmlNode::next((XmlNode *)&local_860);
    std::shared_ptr<libcellml::XmlNode>::operator=
              ((shared_ptr<libcellml::XmlNode> *)&testValueCount,&local_860);
    std::shared_ptr<libcellml::XmlNode>::~shared_ptr(&local_860);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_880,"test_value",&local_881);
  checkResetChildMultiplicity(this,sVar2,&local_880,reset,component);
  std::__cxx11::string::~string((string *)&local_880);
  std::allocator<char>::~allocator(&local_881);
  sVar2 = local_6c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a8,"reset_value",&local_8a9);
  checkResetChildMultiplicity(this,sVar2,&local_8a8,reset,component);
  std::__cxx11::string::~string((string *)&local_8a8);
  std::allocator<char>::~allocator(&local_8a9);
  std::shared_ptr<libcellml::XmlNode>::~shared_ptr
            ((shared_ptr<libcellml::XmlNode> *)&testValueCount);
  std::shared_ptr<libcellml::XmlAttribute>::~shared_ptr
            ((shared_ptr<libcellml::XmlAttribute> *)local_40);
  return;
}

Assistant:

void Parser::ParserImpl::loadReset(const ResetPtr &reset, const ComponentPtr &component, const XmlNodePtr &node)
{
    int order = 0;
    bool orderValid = false;
    bool orderDefined = false;

    XmlAttributePtr attribute = node->firstAttribute();
    while (attribute != nullptr) {
        if (attribute->isType("variable")) {
            const std::string variableReference = attribute->value();
            VariablePtr referencedVariable = component->variable(variableReference);

            if (referencedVariable == nullptr) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Reset referencing variable '" + variableReference + "' is not a valid reference for a variable in component '" + component->name() + "'.");
                issue->mPimpl->mItem->mPimpl->setReset(reset);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::RESET_VARIABLE_REFERENCE);
                addIssue(issue);
            } else {
                reset->setVariable(referencedVariable);
            }
        } else if (attribute->isType("test_variable")) {
            const std::string testVariableReference = attribute->value();
            VariablePtr testVariable = component->variable(testVariableReference);
            if (testVariable == nullptr) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Reset referencing test_variable '" + testVariableReference + "' is not a valid reference for a variable in component '" + component->name() + "'.");
                issue->mPimpl->mItem->mPimpl->setReset(reset);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::RESET_TEST_VARIABLE_REFERENCE);
                addIssue(issue);
            } else {
                reset->setTestVariable(testVariable);
            }
        } else if (attribute->isType("order")) {
            orderDefined = true;
            orderValid = isCellMLInteger(attribute->value());
            if (orderValid) {
                orderValid = convertToInt(attribute->value(), order);
                if (!orderValid) {
                    std::string variableName;
                    if (reset->variable() != nullptr) {
                        variableName = reset->variable()->name();
                    }
                    auto issue = Issue::IssueImpl::create();
                    issue->mPimpl->setDescription("Reset in component '" + component->name() + "' referencing variable '" + variableName + "' has an out of range integer order value '" + attribute->value() + "'.");
                    issue->mPimpl->mItem->mPimpl->setReset(reset);
                    issue->mPimpl->setReferenceRule(Issue::ReferenceRule::RESET_ORDER_VALUE);
                    addIssue(issue);
                }
            } else { // This value won't be saved for validation later, so it does need to be reported now.
                std::string variableName;
                if (reset->variable() != nullptr) {
                    variableName = reset->variable()->name();
                }
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Reset in component '" + component->name() + "' referencing variable '" + variableName + "' has a non-integer order value '" + attribute->value() + "'.");
                issue->mPimpl->mItem->mPimpl->setReset(reset);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::RESET_ORDER_VALUE);
                addIssue(issue);
            }
        } else if (attribute->isType("id")) {
            reset->setId(attribute->value());
        } else {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Reset in component '" + component->name() + "' has an invalid attribute '" + attribute->name() + "'.");
            issue->mPimpl->mItem->mPimpl->setReset(reset);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::RESET_ATTRIBUTE_REQUIRED);
            addIssue(issue);
        }
        attribute = attribute->next();
    }

    if (orderValid) {
        reset->setOrder(order);
    } else if (!orderDefined) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Reset in component '" + component->name() + "' does not have its order set.");
        issue->mPimpl->mItem->mPimpl->setReset(reset);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::RESET_ORDER_VALUE);
        addIssue(issue);
    }

    XmlNodePtr childNode = node->firstChild();

    size_t testValueCount = 0;
    size_t resetValueCount = 0;
    while (childNode != nullptr) {
        if (childNode->isCellml20Element("test_value")) {
            loadResetChild("test_value", reset, component, childNode);
            testValueCount++;
        } else if (childNode->isCellml20Element("reset_value")) {
            loadResetChild("reset_value", reset, component, childNode);
            resetValueCount++;
        } else if (childNode->isText()) {
            std::string textNode = childNode->convertToString();
            // Ignore whitespace when parsing.
            if (hasNonWhitespaceCharacters(textNode)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Reset has an invalid non-whitespace child text element '" + textNode + "'. Either a test_value block or a reset_value block is expected.");
                issue->mPimpl->mItem->mPimpl->setReset(reset);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_CHARACTER);
                addIssue(issue);
            }
        } else if (childNode->isComment()) {
            // Do nothing.
        } else {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Reset in component '" + component->name() + "' has an invalid child '" + childNode->name() + "'.");
            issue->mPimpl->mItem->mPimpl->setReset(reset);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_ELEMENT);
            addIssue(issue);
        }
        childNode = childNode->next();
    }

    checkResetChildMultiplicity(testValueCount, "test_value", reset, component);
    checkResetChildMultiplicity(resetValueCount, "reset_value", reset, component);
}